

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O0

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  undefined8 uVar1;
  bool bVar2;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  *this_00;
  pointer ppVar3;
  char *pcVar4;
  reference str1;
  ostream *poVar5;
  string *psVar6;
  mapped_type *this_01;
  string local_470 [32];
  undefined1 local_450 [8];
  ostringstream e_1;
  allocator<char> local_2d1;
  string local_2d0;
  undefined1 local_2b0 [8];
  string evaluatedValue;
  char *propertyValue;
  string local_280 [32];
  undefined1 local_260 [8];
  ostringstream e;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *prop;
  iterator __end2;
  iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  string local_c0;
  undefined1 local_a0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  propsToExport;
  allocator<char> local_69;
  key_type local_68;
  _Self local_48;
  _Self *local_40;
  const_iterator *exportProperties;
  cmPropertyMap *targetProperties;
  string *errorMessage_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *gte_local;
  cmExportFileGenerator *this_local;
  
  targetProperties = (cmPropertyMap *)errorMessage;
  errorMessage_local = (string *)properties;
  properties_local = (ImportPropertyMap *)gte;
  gte_local = (cmGeneratorTarget *)this;
  this_00 = &cmTarget::GetProperties(gte->Target)->
             super_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
  ;
  exportProperties = (const_iterator *)this_00;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"EXPORT_PROPERTIES",&local_69);
  local_48._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
       ::find(this_00,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  local_40 = &local_48;
  propsToExport.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>_>
                       *)exportProperties);
  bVar2 = std::operator!=(&local_48,
                          (_Self *)&propsToExport.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (bVar2) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_a0);
    ppVar3 = std::
             _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmProperty>_>
             ::operator->(local_40);
    pcVar4 = cmProperty::GetValue(&ppVar3->second);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,pcVar4,(allocator<char> *)((long)&__range2 + 7));
    cmSystemTools::ExpandListArgument
              (&local_c0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)local_a0,false);
    std::__cxx11::string::~string((string *)&local_c0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&__range2 + 7));
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_a0);
    prop = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_a0);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&prop), bVar2) {
      str1 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end2);
      bVar2 = cmsys::SystemTools::StringStartsWith(str1,"IMPORTED_");
      if ((bVar2) || (bVar2 = cmsys::SystemTools::StringStartsWith(str1,"INTERFACE_"), bVar2)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_260);
        poVar5 = std::operator<<((ostream *)local_260,"Target \"");
        psVar6 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)&(properties_local->_M_t)._M_impl);
        poVar5 = std::operator<<(poVar5,(string *)psVar6);
        poVar5 = std::operator<<(poVar5,"\" contains property \"");
        poVar5 = std::operator<<(poVar5,(string *)str1);
        poVar5 = std::operator<<(poVar5,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ");
        std::operator<<(poVar5,"properties are reserved.");
        std::__cxx11::ostringstream::str();
        std::__cxx11::string::operator=((string *)targetProperties,local_280);
        std::__cxx11::string::~string(local_280);
        this_local._7_1_ = 0;
        bVar2 = true;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_260);
        goto LAB_004e4901;
      }
      pcVar4 = cmPropertyMap::GetPropertyValue((cmPropertyMap *)exportProperties,str1);
      evaluatedValue.field_2._8_8_ = pcVar4;
      if (pcVar4 != (char *)0x0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d0,pcVar4,&local_2d1);
        cmGeneratorExpression::Preprocess
                  ((string *)local_2b0,&local_2d0,StripAllGeneratorExpressions,false);
        std::__cxx11::string::~string((string *)&local_2d0);
        std::allocator<char>::~allocator(&local_2d1);
        bVar2 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_2b0,(char *)evaluatedValue.field_2._8_8_);
        uVar1 = evaluatedValue.field_2._8_8_;
        if (bVar2) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_450);
          poVar5 = std::operator<<((ostream *)local_450,"Target \"");
          psVar6 = cmTarget::GetName_abi_cxx11_(*(cmTarget **)&(properties_local->_M_t)._M_impl);
          poVar5 = std::operator<<(poVar5,(string *)psVar6);
          poVar5 = std::operator<<(poVar5,"\" contains property \"");
          poVar5 = std::operator<<(poVar5,(string *)str1);
          poVar5 = std::operator<<(poVar5,"\" in EXPORT_PROPERTIES but this property contains a ");
          std::operator<<(poVar5,"generator expression. This is not allowed.");
          std::__cxx11::ostringstream::str();
          std::__cxx11::string::operator=((string *)targetProperties,local_470);
          std::__cxx11::string::~string(local_470);
          this_local._7_1_ = 0;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_450);
        }
        else {
          this_01 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                  *)errorMessage_local,str1);
          std::__cxx11::string::operator=((string *)this_01,(char *)uVar1);
        }
        std::__cxx11::string::~string((string *)local_2b0);
        if (bVar2) goto LAB_004e4901;
      }
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
    bVar2 = false;
LAB_004e4901:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_a0);
    if (bVar2 != false) goto LAB_004e492f;
  }
  this_local._7_1_ = 1;
LAB_004e492f:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  auto& targetProperties = gte->Target->GetProperties();
  const auto& exportProperties = targetProperties.find("EXPORT_PROPERTIES");
  if (exportProperties != targetProperties.end()) {
    std::vector<std::string> propsToExport;
    cmSystemTools::ExpandListArgument(exportProperties->second.GetValue(),
                                      propsToExport);
    for (auto& prop : propsToExport) {
      /* Black list reserved properties */
      if (cmSystemTools::StringStartsWith(prop, "IMPORTED_") ||
          cmSystemTools::StringStartsWith(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      auto propertyValue = targetProperties.GetPropertyValue(prop);
      if (propertyValue == nullptr) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = propertyValue;
    }
  }
  return true;
}